

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

FLOAT __thiscall Matrix::mean(Matrix *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  
  iVar1 = this->m;
  if ((long)iVar1 < 1) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    lVar2 = 0;
    do {
      if (0 < this->n) {
        uVar3 = 0;
        do {
          dVar4 = dVar4 + this->val[lVar2][uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)this->n != uVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != iVar1);
  }
  return dVar4 / (double)(iVar1 * this->n);
}

Assistant:

FLOAT Matrix::mean () {
  FLOAT mean = 0;
  for (int32_t i=0; i<m; i++)
    for (int32_t j=0; j<n; j++)
      mean += val[i][j];
  return mean/(FLOAT)(m*n);
}